

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O0

Gia_Man_t * Unr_ManUnrollFrame(Unr_Man_t *p,int f)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  Unr_Obj_t *pObj;
  Unr_Obj_t *pUnrObj;
  int hStart;
  int iLit1;
  int iLit0;
  int iLit;
  int i;
  int f_local;
  Unr_Man_t *p_local;
  
  for (iLit0 = 0; iVar2 = Gia_ManPiNum(p->pGia), iLit0 < iVar2; iLit0 = iLit0 + 1) {
    pVVar1 = p->vPiLits;
    iVar2 = Gia_ManAppendCi(p->pFrames);
    Vec_IntPush(pVVar1,iVar2);
  }
  pVVar1 = p->vObjLim;
  iVar2 = Vec_IntSize(p->vObjLim);
  iVar2 = Abc_MaxInt(0,(iVar2 + -1) - f);
  for (pUnrObj._0_4_ = Vec_IntEntry(pVVar1,iVar2); p->pObjs + (int)pUnrObj < p->pEnd;
      pUnrObj._0_4_ = iVar2 + (int)pUnrObj) {
    pObj = Unr_ManObj(p,(int)pUnrObj);
    if ((((uint)(*(ulong *)&pObj->field_0x8 >> 2) & 0x7fff) == 0x7fff) ||
       (((uint)(*(ulong *)&pObj->field_0x8 >> 0x11) & 0x7fff) == 0x7fff)) {
      if ((((uint)(*(ulong *)&pObj->field_0x8 >> 2) & 0x7fff) == 0x7fff) ||
         (((uint)(*(ulong *)&pObj->field_0x8 >> 0x11) & 0x7fff) != 0x7fff)) {
        if (((*(ulong *)&pObj->field_0x8 >> 0x20 & 1) == 0) || (f < (int)pObj->hFan1)) {
          __assert_fail("pUnrObj->fItIsPi && f >= (int)pUnrObj->hFan1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcUnroll.c"
                        ,0x194,"Gia_Man_t *Unr_ManUnrollFrame(Unr_Man_t *, int)");
        }
        pVVar1 = p->vPiLits;
        iVar2 = Gia_ManPiNum(p->pGia);
        iVar2 = Vec_IntEntry(pVVar1,iVar2 * (f - pObj->hFan1) + pObj->hFan0);
        Unr_ManObjSetValue(pObj,iVar2);
      }
      else {
        iVar2 = Unr_ManFanin0Value(p,pObj);
        Unr_ManObjSetValue(pObj,iVar2);
        if ((*(ulong *)&pObj->field_0x8 >> 0x21 & 1) != 0) {
          Gia_ManAppendCo(p->pFrames,iVar2);
        }
      }
    }
    else {
      iVar2 = Unr_ManFanin0Value(p,pObj);
      iVar3 = Unr_ManFanin1Value(p,pObj);
      iVar2 = Gia_ManHashAnd(p->pFrames,iVar2,iVar3);
      Unr_ManObjSetValue(pObj,iVar2);
    }
    iVar2 = Unr_ObjSize(pObj);
  }
  if (p->pObjs + (int)pUnrObj != p->pEnd) {
    __assert_fail("p->pObjs + hStart == p->pEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcUnroll.c"
                  ,0x19a,"Gia_Man_t *Unr_ManUnrollFrame(Unr_Man_t *, int)");
  }
  iVar2 = Gia_ManPoNum(p->pFrames);
  iVar3 = Gia_ManPoNum(p->pGia);
  if (iVar2 != (f + 1) * iVar3) {
    __assert_fail("Gia_ManPoNum(p->pFrames) == (f + 1) * Gia_ManPoNum(p->pGia)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcUnroll.c"
                  ,0x19b,"Gia_Man_t *Unr_ManUnrollFrame(Unr_Man_t *, int)");
  }
  return p->pFrames;
}

Assistant:

Gia_Man_t * Unr_ManUnrollFrame( Unr_Man_t * p, int f )
{
    int i, iLit, iLit0, iLit1, hStart;
    for ( i = 0; i < Gia_ManPiNum(p->pGia); i++ )
        Vec_IntPush( p->vPiLits, Gia_ManAppendCi(p->pFrames) );
    hStart = Vec_IntEntry( p->vObjLim, Abc_MaxInt(0, Vec_IntSize(p->vObjLim)-1-f) );
    while ( p->pObjs + hStart < p->pEnd )
    {
        Unr_Obj_t * pUnrObj = Unr_ManObj( p, hStart );
        if ( pUnrObj->uRDiff0 != UNR_DIFF_NULL && pUnrObj->uRDiff1 != UNR_DIFF_NULL ) // AND node
        {
            iLit0 = Unr_ManFanin0Value( p, pUnrObj );
            iLit1 = Unr_ManFanin1Value( p, pUnrObj );
            iLit  = Gia_ManHashAnd( p->pFrames, iLit0, iLit1 );
            Unr_ManObjSetValue( pUnrObj, iLit );
        }
        else if ( pUnrObj->uRDiff0 != UNR_DIFF_NULL && pUnrObj->uRDiff1 == UNR_DIFF_NULL ) // PO/RI/RO
        {
            iLit  = Unr_ManFanin0Value( p, pUnrObj );
            Unr_ManObjSetValue( pUnrObj, iLit );
            if ( pUnrObj->fItIsPo )
                Gia_ManAppendCo( p->pFrames, iLit );
        }
        else // PI  (pUnrObj->hFan0 is CioId; pUnrObj->hFan1 is tent)
        {
            assert( pUnrObj->fItIsPi && f >= (int)pUnrObj->hFan1 );
            iLit = Vec_IntEntry( p->vPiLits, Gia_ManPiNum(p->pGia) * (f - pUnrObj->hFan1) + pUnrObj->hFan0 );
            Unr_ManObjSetValue( pUnrObj, iLit );
        }
        hStart += Unr_ObjSize( pUnrObj );
    }
    assert( p->pObjs + hStart == p->pEnd );
    assert( Gia_ManPoNum(p->pFrames) == (f + 1) * Gia_ManPoNum(p->pGia) );
    return p->pFrames;
}